

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string-view.cc
# Opt level: O0

size_type __thiscall wabt::string_view::find(string_view *this,char c,size_type pos)

{
  size_type sVar1;
  string_view local_30;
  size_type local_20;
  size_type pos_local;
  string_view *psStack_10;
  char c_local;
  string_view *this_local;
  
  local_20 = pos;
  pos_local._7_1_ = c;
  psStack_10 = this;
  string_view(&local_30,(char *)((long)&pos_local + 7),1);
  sVar1 = find(this,local_30,local_20);
  return sVar1;
}

Assistant:

string_view::size_type string_view::find(char c, size_type pos) const noexcept {
  return find(string_view(&c, 1), pos);
}